

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

void __thiscall
CTcSymPropBase::CTcSymPropBase
          (CTcSymPropBase *this,char *str,size_t len,int copy,tctarg_prop_id_t prop)

{
  undefined4 in_ECX;
  char *in_RDX;
  CTcSymbol *in_RSI;
  undefined8 *in_RDI;
  undefined2 in_R8W;
  undefined2 in_stack_ffffffffffffffe0;
  
  CTcSymbol::CTcSymbol
            (in_RSI,in_RDX,CONCAT44(in_ECX,CONCAT22(in_R8W,in_stack_ffffffffffffffe0)),
             (int)((ulong)in_RDI >> 0x20),(tc_symtype_t)in_RDI);
  *in_RDI = &PTR__CTcSymPropBase_004320b0;
  *(undefined2 *)(in_RDI + 5) = in_R8W;
  *(byte *)((long)in_RDI + 0x2a) = *(byte *)((long)in_RDI + 0x2a) & 0xfe;
  *(byte *)((long)in_RDI + 0x2a) = *(byte *)((long)in_RDI + 0x2a) & 0xfd;
  *(byte *)((long)in_RDI + 0x2a) = *(byte *)((long)in_RDI + 0x2a) & 0xfb;
  return;
}

Assistant:

CTcSymPropBase(const char *str, size_t len, int copy,
                   tctarg_prop_id_t prop)
        : CTcSymbol(str, len, copy, TC_SYM_PROP)
    {
        /* remember our property ID */
        prop_ = prop;

        /* we're not referenced yet */
        ref_ = FALSE;

        /* presume it's not a vocabulary property */
        vocab_ = FALSE;

        /* presume it's not a weak property assumption */
        weak_ = FALSE;
    }